

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O3

void __thiscall AutoSetDispatchHaltFlag::~AutoSetDispatchHaltFlag(AutoSetDispatchHaltFlag *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebugManager *pDVar4;
  
  pDVar4 = this->m_threadContext->debugManager;
  if (pDVar4->isAtDispatchHalt == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xe6,"(m_threadContext->GetDebugManager()->IsAtDispatchHalt())",
                       "m_threadContext->GetDebugManager()->IsAtDispatchHalt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pDVar4 = this->m_threadContext->debugManager;
  }
  pDVar4->isAtDispatchHalt = false;
  Js::ScriptContext::GetDebugContext(this->m_scriptContext);
}

Assistant:

AutoSetDispatchHaltFlag::~AutoSetDispatchHaltFlag()
{
    Assert(m_threadContext->GetDebugManager()->IsAtDispatchHalt());
    m_threadContext->GetDebugManager()->SetDispatchHalt(false);

    Assert(m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext());
    m_scriptContext->GetDebugContext()->GetProbeContainer()->SetIsPrimaryBrokenToDebuggerContext(false);
}